

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O2

void end_scope(LinearizerState *linearizer,Proc *proc,uint line_number)

{
  Scope *scope;
  Pseudo *pseudo;
  LuaSymbol *pLVar1;
  uint uVar2;
  PtrListIterator symiter__;
  
  scope = (Scope *)(linearizer->C_declarations).pos;
  if ((scope->field_0x18 & 1) != 0) {
    instruct_close((Proc *)linearizer,(BasicBlock *)linearizer[1].compiler_state,scope,(uint)proc);
  }
  raviX_ptrlist_reverse_iterator(&symiter__,(PtrList *)scope->symbol_list);
  pLVar1 = (LuaSymbol *)raviX_ptrlist_iter_prev(&symiter__);
  do {
    if (pLVar1 == (LuaSymbol *)0x0) {
      (linearizer->C_declarations).pos = (size_t)scope->parent;
      return;
    }
    if (pLVar1->symbol_type == SYM_LOCAL) {
      pseudo = (pLVar1->field_1).variable.pseudo;
      uVar2 = *(uint *)pseudo & 0xf;
      if (uVar2 - 1 < 3) {
        if (pLVar1 != (pseudo->field_3).symbol) {
          __assert_fail("sym == pseudo->temp_for_local",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                        ,0xbd5,"void end_scope(LinearizerState *, Proc *, unsigned int)");
        }
        free_temp_pseudo((Proc *)linearizer,pseudo,true);
      }
      else {
        if (uVar2 != 0) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                        ,0xbd9,"void end_scope(LinearizerState *, Proc *, unsigned int)");
        }
        if ((pseudo->field_3).symbol != pLVar1) {
          __assert_fail("pseudo && pseudo->type == PSEUDO_SYMBOL && pseudo->symbol == sym",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                        ,0xbd1,"void end_scope(LinearizerState *, Proc *, unsigned int)");
        }
        free_register((Proc *)&linearizer[1].current_proc,
                      (PseudoGenerator *)(ulong)(*(uint *)pseudo >> 4 & 0xffff),0);
      }
    }
    pLVar1 = (LuaSymbol *)raviX_ptrlist_iter_prev(&symiter__);
  } while( true );
}

Assistant:

static void end_scope(LinearizerState *linearizer, Proc *proc, unsigned line_number)
{
	Scope *scope = proc->current_scope;
	LuaSymbol *sym;
	if (scope->need_close) {
		instruct_close(proc, proc->current_bb, scope, line_number);
	}
	FOR_EACH_PTR_REVERSE(scope->symbol_list, LuaSymbol, sym)
	{
		if (sym->symbol_type == SYM_LOCAL) {
			Pseudo *pseudo = sym->variable.pseudo;
			if (pseudo->type == PSEUDO_SYMBOL) {
				assert(pseudo && pseudo->type == PSEUDO_SYMBOL && pseudo->symbol == sym);
				free_register(proc, &proc->local_pseudos, pseudo->regnum);
			}
			else if (pseudo->type == PSEUDO_TEMP_INT || pseudo->type == PSEUDO_TEMP_FLT || pseudo->type == PSEUDO_TEMP_BOOL) {
				assert(sym == pseudo->temp_for_local);
				free_temp_pseudo(proc, sym->variable.pseudo, true);
			}
			else {
				assert(false);
			}
		}
	}
	END_FOR_EACH_PTR_REVERSE(sym)
	proc->current_scope = scope->parent;
}